

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void cf_poly1305_finish(cf_poly1305 *ctx,uint8_t *out)

{
  ulong local_70;
  size_t i;
  uint32_t s [17];
  uint8_t *out_local;
  cf_poly1305 *ctx_local;
  
  if (ctx->npartial != 0) {
    poly1305_last_block(ctx);
  }
  for (local_70 = 0; local_70 < 0x10; local_70 = local_70 + 1) {
    s[local_70 - 2] = (uint)ctx->s[local_70];
  }
  s[0xe] = 0;
  poly1305_full_reduce(ctx->h);
  poly1305_add(ctx->h,(uint32_t *)&i);
  for (local_70 = 0; local_70 < 0x10; local_70 = local_70 + 1) {
    out[local_70] = (uint8_t)ctx->h[local_70];
  }
  mem_clean(ctx,0xb0);
  return;
}

Assistant:

void cf_poly1305_finish(cf_poly1305 *ctx,
                        uint8_t out[16])
{
  if (ctx->npartial)
    poly1305_last_block(ctx);

  uint32_t s[17];
  size_t i;
  for (i = 0; i < 16; i++)
    s[i] = ctx->s[i];
  s[16] = 0;

  poly1305_full_reduce(ctx->h);
  poly1305_add(ctx->h, s);

  for (i = 0; i < 16; i++)
    out[i] = ctx->h[i];

  mem_clean(ctx, sizeof *ctx);
}